

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_d2bc6b::HandleCacheMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  _Rb_tree_node_base *key;
  int iVar1;
  cmake *pcVar2;
  cmValue cVar3;
  cmState *this;
  _Rb_tree_node_base *p_Var4;
  char *extraout_RDX;
  _Rb_tree_header *p_Var5;
  undefined3 in_register_00000089;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value_00;
  string local_98;
  string *local_78;
  uint local_70;
  undefined4 local_6c;
  string *local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  _Base_ptr local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_6c = CONCAT31(in_register_00000089,appendMode);
  iVar1 = std::__cxx11::string::compare((char *)propertyName);
  if (iVar1 == 0) {
    if (((!remove) &&
        (value._M_str = extraout_RDX, value._M_len = (size_t)(propertyValue->_M_dataplus)._M_p,
        bVar6 = cmValue::IsOn((cmValue *)propertyValue->_M_string_length,value), !bVar6)) &&
       (value_00._M_str = (propertyValue->_M_dataplus)._M_p,
       value_00._M_len = propertyValue->_M_string_length, bVar6 = cmValue::IsOff(value_00), !bVar6))
    {
      local_48 = (propertyValue->_M_dataplus)._M_p;
      local_50 = (_Base_ptr)propertyValue->_M_string_length;
      local_60._M_len = 0x19;
      local_60._M_str = "given non-boolean value \"";
      local_40 = 0x22;
      local_38 = "\" for CACHE property \"ADVANCED\".  ";
      views_00._M_len = 3;
      views_00._M_array = &local_60;
      cmCatViews_abi_cxx11_(&local_98,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_002d34b8;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)propertyName);
    if (iVar1 == 0) {
      bVar6 = cmState::IsCacheEntryType(propertyValue);
      if (!bVar6) {
        local_48 = (propertyValue->_M_dataplus)._M_p;
        local_50 = (_Base_ptr)propertyValue->_M_string_length;
        local_60._M_len = 0x20;
        local_60._M_str = "given invalid CACHE entry TYPE \"";
        local_40 = 1;
        local_38 = "\"";
        views_02._M_len = 3;
        views_02._M_array = &local_60;
        cmCatViews_abi_cxx11_(&local_98,views_02);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002d34b8;
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)propertyName);
      if (((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)propertyName), iVar1 != 0)
          ) && (iVar1 = std::__cxx11::string::compare((char *)propertyName), iVar1 != 0)) {
        local_48 = (propertyName->_M_dataplus)._M_p;
        local_50 = (_Base_ptr)propertyName->_M_string_length;
        local_60._M_len = 0x1d;
        local_60._M_str = "given invalid CACHE property ";
        local_40 = 0x51;
        local_38 = 
        ".  Settable CACHE properties are: ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
        views._M_len = 3;
        views._M_array = &local_60;
        cmCatViews_abi_cxx11_(&local_98,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002d34b8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
    }
  }
  p_Var4 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(names->_M_t)._M_impl.super__Rb_tree_header;
  bVar6 = (_Rb_tree_header *)p_Var4 == p_Var5;
  if (!bVar6) {
    local_68 = (string *)&status->Error;
    local_70 = (uint)appendAsString;
    local_78 = propertyName;
    do {
      key = p_Var4 + 1;
      pcVar2 = cmMakefile::GetCMakeInstance(status->Makefile);
      cVar3 = cmState::GetCacheEntryValue
                        ((pcVar2->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)key);
      if (cVar3.Value == (string *)0x0) {
        local_48 = *(pointer *)(p_Var4 + 1);
        local_50 = p_Var4[1]._M_parent;
        local_60._M_len = 0x1e;
        local_60._M_str = "could not find CACHE variable ";
        local_40 = 0x27;
        local_38 = ".  Perhaps it has not yet been created.";
        views_01._M_len = 3;
        views_01._M_array = &local_60;
        cmCatViews_abi_cxx11_(&local_98,views_01);
        std::__cxx11::string::_M_assign(local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        this = cmMakefile::GetState(status->Makefile);
        if (remove) {
          cmState::RemoveCacheEntryProperty(this,(string *)key,local_78);
        }
        if ((char)local_6c == '\0') {
          cmState::SetCacheEntryProperty(this,(string *)key,local_78,propertyValue);
        }
        else {
          cmState::AppendCacheEntryProperty
                    (this,(string *)key,local_78,propertyValue,SUB41(local_70,0));
        }
      }
      if (cVar3.Value == (string *)0x0) {
        return bVar6;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      bVar6 = (_Rb_tree_header *)p_Var4 == p_Var5;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool HandleCacheMode(cmExecutionStatus& status,
                     const std::set<std::string>& names,
                     const std::string& propertyName,
                     const std::string& propertyValue, bool appendAsString,
                     bool appendMode, bool remove)
{
  if (propertyName == "ADVANCED") {
    if (!remove && !cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      status.SetError(cmStrCat("given non-boolean value \"", propertyValue,
                               R"(" for CACHE property "ADVANCED".  )"));
      return false;
    }
  } else if (propertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(propertyValue)) {
      status.SetError(
        cmStrCat("given invalid CACHE entry TYPE \"", propertyValue, "\""));
      return false;
    }
  } else if (propertyName != "HELPSTRING" && propertyName != "STRINGS" &&
             propertyName != "VALUE") {
    status.SetError(
      cmStrCat("given invalid CACHE property ", propertyName,
               ".  "
               "Settable CACHE properties are: "
               "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE."));
    return false;
  }

  for (std::string const& name : names) {
    // Get the source file.
    cmake* cm = status.GetMakefile().GetCMakeInstance();
    cmValue existingValue = cm->GetState()->GetCacheEntryValue(name);
    if (existingValue) {
      if (!HandleCacheEntry(name, status.GetMakefile(), propertyName,
                            propertyValue, appendAsString, appendMode,
                            remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find CACHE variable ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}